

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

String * __thiscall
capnp::compiler::ValueTranslator::makeTypeName
          (String *__return_storage_ptr__,ValueTranslator *this,Type type)

{
  Which WVar1;
  Schema schema;
  char *pcVar2;
  char (*in_R8) [2];
  Type type_00;
  Type type_local;
  Array<char> local_30;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  WVar1 = LIST;
  if (((undefined1  [16])type & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    WVar1 = type.baseType;
  }
  switch(WVar1) {
  case VOID:
    pcVar2 = "Void";
    break;
  case BOOL:
    pcVar2 = "Bool";
    break;
  case INT8:
    pcVar2 = "Int8";
    break;
  case INT16:
    pcVar2 = "Int16";
    goto LAB_0015c8d3;
  case INT32:
    pcVar2 = "Int32";
    goto LAB_0015c8d3;
  case INT64:
    pcVar2 = "Int64";
    goto LAB_0015c8d3;
  case UINT8:
    pcVar2 = "UInt8";
LAB_0015c8d3:
    kj::str<char_const(&)[6]>(__return_storage_ptr__,(kj *)pcVar2,(char (*) [6])type_local._0_8_);
    return __return_storage_ptr__;
  case UINT16:
    pcVar2 = "UInt16";
    goto LAB_0015c906;
  case UINT32:
    pcVar2 = "UInt32";
    goto LAB_0015c906;
  case UINT64:
    pcVar2 = "UInt64";
LAB_0015c906:
    kj::str<char_const(&)[7]>(__return_storage_ptr__,(kj *)pcVar2,(char (*) [7])type_local._0_8_);
    return __return_storage_ptr__;
  case FLOAT32:
    pcVar2 = "Float32";
    goto LAB_0015c8f5;
  case FLOAT64:
    pcVar2 = "Float64";
LAB_0015c8f5:
    kj::str<char_const(&)[8]>(__return_storage_ptr__,(kj *)pcVar2,(char (*) [8])type_local._0_8_);
    return __return_storage_ptr__;
  case TEXT:
    pcVar2 = "Text";
    break;
  case DATA:
    pcVar2 = "Data";
    break;
  case LIST:
    type_00 = (Type)Type::asList(&type_local);
    makeTypeName((String *)&local_30,this,type_00);
    kj::str<char_const(&)[6],kj::String,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)"List(",(char (*) [6])&local_30,(String *)0x1ee169,in_R8
              );
    kj::Array<char>::~Array(&local_30);
    return __return_storage_ptr__;
  case ENUM:
    schema.raw = (RawBrandedSchema *)Type::asEnum(&type_local);
    goto LAB_0015c8a5;
  case STRUCT:
    schema.raw = (RawBrandedSchema *)Type::asStruct(&type_local);
    goto LAB_0015c8a5;
  case INTERFACE:
    schema.raw = (RawBrandedSchema *)Type::asInterface(&type_local);
LAB_0015c8a5:
    makeNodeName(__return_storage_ptr__,this,schema);
    return __return_storage_ptr__;
  case ANY_POINTER:
    kj::str<char_const(&)[11]>
              (__return_storage_ptr__,(kj *)0x2070b0,(char (*) [11])type_local._0_8_);
    return __return_storage_ptr__;
  default:
    kj::_::unreachable();
  }
  kj::str<char_const(&)[5]>(__return_storage_ptr__,(kj *)pcVar2,(char (*) [5])type_local._0_8_);
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeTypeName(Type type) {
  switch (type.which()) {
    case schema::Type::VOID: return kj::str("Void");
    case schema::Type::BOOL: return kj::str("Bool");
    case schema::Type::INT8: return kj::str("Int8");
    case schema::Type::INT16: return kj::str("Int16");
    case schema::Type::INT32: return kj::str("Int32");
    case schema::Type::INT64: return kj::str("Int64");
    case schema::Type::UINT8: return kj::str("UInt8");
    case schema::Type::UINT16: return kj::str("UInt16");
    case schema::Type::UINT32: return kj::str("UInt32");
    case schema::Type::UINT64: return kj::str("UInt64");
    case schema::Type::FLOAT32: return kj::str("Float32");
    case schema::Type::FLOAT64: return kj::str("Float64");
    case schema::Type::TEXT: return kj::str("Text");
    case schema::Type::DATA: return kj::str("Data");
    case schema::Type::LIST:
      return kj::str("List(", makeTypeName(type.asList().getElementType()), ")");
    case schema::Type::ENUM: return makeNodeName(type.asEnum());
    case schema::Type::STRUCT: return makeNodeName(type.asStruct());
    case schema::Type::INTERFACE: return makeNodeName(type.asInterface());
    case schema::Type::ANY_POINTER: return kj::str("AnyPointer");
  }
  KJ_UNREACHABLE;
}